

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_FontMetrics::IsUnset(ON_FontMetrics *this)

{
  bool local_11;
  ON_FontMetrics *this_local;
  
  local_11 = false;
  if ((((((this->m_UPM == 0) && (local_11 = false, this->m_ascent == 0)) &&
        (local_11 = false, this->m_descent == 0)) &&
       ((local_11 = false, this->m_line_space == 0 &&
        (local_11 = false, this->m_ascent_of_capital == 0)))) &&
      ((local_11 = false, this->m_ascent_of_x == 0 &&
       ((local_11 = false, this->m_strikeout_thickness == 0 &&
        (local_11 = false, this->m_strikeout_position == 0)))))) &&
     (local_11 = false, this->m_underscore_thickness == 0)) {
    local_11 = this->m_underscore_position == 0;
  }
  return local_11;
}

Assistant:

bool ON_FontMetrics::IsUnset() const
{
  return (
    0 == m_UPM
    && 0 == m_ascent
    && 0 == m_descent
    && 0 == m_line_space
    && 0 == m_ascent_of_capital
    && 0 == m_ascent_of_x
    && 0 == m_strikeout_thickness
    && 0 == m_strikeout_position
    && 0 == m_underscore_thickness
    && 0 == m_underscore_position
    );
}